

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O1

void __thiscall AVIMaker::addFrame(AVIMaker *this,size_t stream_id,TRIPLERGB **frame)

{
  pointer *ppppTVar1;
  VideoStream *pVVar2;
  iterator __position;
  TRIPLERGB **local_8;
  
  pVVar2 = (this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>.
           _M_impl.super__Vector_impl_data._M_start[stream_id];
  __position._M_current =
       *(pointer *)
        ((long)&(pVVar2->frames).super__Vector_base<TRIPLERGB_**,_std::allocator<TRIPLERGB_**>_>.
                _M_impl + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&(pVVar2->frames).super__Vector_base<TRIPLERGB_**,_std::allocator<TRIPLERGB_**>_>.
               _M_impl + 0x10)) {
    local_8 = frame;
    std::vector<TRIPLERGB**,std::allocator<TRIPLERGB**>>::_M_realloc_insert<TRIPLERGB**const&>
              ((vector<TRIPLERGB**,std::allocator<TRIPLERGB**>> *)&pVVar2->frames,__position,
               &local_8);
  }
  else {
    *__position._M_current = frame;
    ppppTVar1 = (pointer *)
                ((long)&(pVVar2->frames).
                        super__Vector_base<TRIPLERGB_**,_std::allocator<TRIPLERGB_**>_>._M_impl + 8)
    ;
    *ppppTVar1 = *ppppTVar1 + 1;
  }
  return;
}

Assistant:

void AVIMaker::addFrame(size_t stream_id, TRIPLERGB **frame) {
    VideoStream *videoStream = this->videoStreams[stream_id];
    videoStream->frames.push_back(frame);
}